

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsItem::setTransformations(QGraphicsItem *this,QList<QGraphicsTransform_*> *transformations)

{
  QGraphicsItemPrivate *pQVar1;
  long i_00;
  qsizetype qVar2;
  QList<QGraphicsTransform_*> *in_RSI;
  QGraphicsTransformPrivate *in_RDI;
  QGraphicsItem *in_stack_00000018;
  int i;
  QList<QGraphicsTransform_*> *in_stack_ffffffffffffffc8;
  TransformData *in_stack_ffffffffffffffd0;
  QList<QGraphicsTransform_*> *this_00;
  TransformData *in_stack_ffffffffffffffd8;
  int local_14;
  
  prepareGeometryChange(in_stack_00000018);
  pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RDI->field_0x8);
  if (pQVar1->transformData == (TransformData *)0x0) {
    in_stack_ffffffffffffffd8 = (TransformData *)operator_new(0x90);
    QGraphicsItemPrivate::TransformData::TransformData(in_stack_ffffffffffffffd0);
    pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                         *)&in_RDI->field_0x8);
    pQVar1->transformData = in_stack_ffffffffffffffd8;
  }
  this_00 = in_RSI;
  QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
            ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *)
             &in_RDI->field_0x8);
  QList<QGraphicsTransform_*>::operator=(this_00,in_stack_ffffffffffffffc8);
  local_14 = 0;
  while( true ) {
    i_00 = (long)local_14;
    qVar2 = QList<QGraphicsTransform_*>::size(in_RSI);
    if (qVar2 <= i_00) break;
    QList<QGraphicsTransform_*>::at(this_00,i_00);
    QGraphicsTransform::d_func((QGraphicsTransform *)0x97eab5);
    QGraphicsTransformPrivate::setItem(in_RDI,(QGraphicsItem *)in_stack_ffffffffffffffd8);
    local_14 = local_14 + 1;
  }
  pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RDI->field_0x8);
  pQVar1->transformData->onlyTransform = false;
  pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RDI->field_0x8);
  *(ulong *)&pQVar1->field_0x160 =
       *(ulong *)&pQVar1->field_0x160 & 0xffdfffffffffffff | 0x20000000000000;
  pQVar1 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)&in_RDI->field_0x8);
  (*pQVar1->_vptr_QGraphicsItemPrivate[4])();
  return;
}

Assistant:

void QGraphicsItem::setTransformations(const QList<QGraphicsTransform *> &transformations)
{
    prepareGeometryChange();
    if (!d_ptr->transformData)
        d_ptr->transformData = new QGraphicsItemPrivate::TransformData;
    d_ptr->transformData->graphicsTransforms = transformations;
    for (int i = 0; i < transformations.size(); ++i)
        transformations.at(i)->d_func()->setItem(this);
    d_ptr->transformData->onlyTransform = false;
    d_ptr->dirtySceneTransform = 1;
    d_ptr->transformChanged();
}